

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Entry * __thiscall
kj::Vector<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>::
add<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>
          (Vector<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry> *this,Entry *params)

{
  Entry *pEVar1;
  size_t sVar2;
  undefined8 *puVar3;
  
  puVar3 = *(undefined8 **)(this + 8);
  if (puVar3 == *(undefined8 **)(this + 0x10)) {
    Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::grow
              ((Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)this,0);
    puVar3 = *(undefined8 **)(this + 8);
  }
  puVar3[2] = *(undefined8 *)&params->value;
  sVar2 = (params->key).super_StringPtr.content.size_;
  *puVar3 = (params->key).super_StringPtr.content.ptr;
  puVar3[1] = sVar2;
  pEVar1 = *(Entry **)(this + 8);
  *(Entry **)(this + 8) = pEVar1 + 1;
  return pEVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }